

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *
immutable::rrb_details::copy_first_k<immutable::vector<char,false,5>,true,5>
          (ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> *in,
          ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_> *new_rrb,uint32_t k,
          uint32_t tail_size)

{
  uint32_t *puVar1;
  rrb<immutable::vector<char,_false,_5>,_true,_5> *prVar2;
  internal_node<immutable::vector<char,_false,_5>,_true> *piVar3;
  rrb_size_table<true> *prVar4;
  ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *this;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> current;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> local_50;
  uint local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> new_current;
  
  local_40 = tail_size;
  local_3c = k;
  prVar2 = ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>::operator->(in);
  current.ptr = (internal_node<immutable::vector<char,_false,_5>,_true> *)(prVar2->root).ptr;
  if (current.ptr != (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
    LOCK();
    ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  prVar2 = ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>::operator->(new_rrb);
  this = &prVar2->root;
  prVar2 = ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>::operator->(in);
  local_48 = prVar2->cnt - 1;
  prVar2 = ref<immutable::rrb<immutable::vector<char,_false,_5>,_true,_5>_>::operator->(in);
  uVar6 = prVar2->shift;
  uVar5 = 1;
  while( true ) {
    if ((local_3c < uVar5) || (uVar6 == 0)) break;
    new_current.ptr = (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0;
    local_44 = uVar6;
    if (local_3c == uVar5) {
      local_50.ptr = internal_node_inc<immutable::vector<char,false,5>,true>(current.ptr);
      if (local_50.ptr != (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
        LOCK();
        ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
      operator=(&new_current,&local_50);
      ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::~ref
                (&local_50);
      piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
               ::operator->(&current);
      if ((piVar3->size_table).ptr != (rrb_size_table<true> *)0x0) {
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        prVar4 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar3->size_table)
        ;
        puVar1 = prVar4->size;
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        uVar6 = puVar1[piVar3->len - 2] + local_40;
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        prVar4 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar3->size_table)
        ;
        puVar1 = prVar4->size;
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        puVar1[piVar3->len - 1] = uVar6;
        uVar6 = local_44;
      }
    }
    else {
      local_50.ptr = internal_node_clone<immutable::vector<char,false,5>,true>(current.ptr);
      if (local_50.ptr != (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
        LOCK();
        ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
      }
      ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
      operator=(&new_current,&local_50);
      ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::~ref
                (&local_50);
      piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
               ::operator->(&current);
      if ((piVar3->size_table).ptr != (rrb_size_table<true> *)0x0) {
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        prVar4 = (piVar3->size_table).ptr;
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        local_50.ptr = (internal_node<immutable::vector<char,_false,_5>,_true> *)
                       size_table_clone<true>(prVar4,piVar3->len);
        if (local_50.ptr != (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
          LOCK();
          ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
        }
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        ref<immutable::rrb_details::rrb_size_table<true>_>::operator=
                  (&piVar3->size_table,
                   (ref<immutable::rrb_details::rrb_size_table<true>_> *)&local_50);
        release((rrb_size_table<true> *)local_50.ptr);
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        prVar4 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar3->size_table)
        ;
        puVar1 = prVar4->size;
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&new_current);
        puVar1[piVar3->len - 1] = puVar1[piVar3->len - 1] + local_40;
        uVar6 = local_44;
      }
    }
    ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                *)this,&new_current);
    piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
             operator->(&current);
    if ((piVar3->size_table).ptr == (rrb_size_table<true> *)0x0) {
      uVar7 = local_48 >> ((byte)uVar6 & 0x1f) & 0x1f;
    }
    else {
      piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
               ::operator->(&new_current);
      uVar6 = piVar3->len;
      uVar7 = uVar6 - 1;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
                 ::operator->(&current);
        prVar4 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar3->size_table)
        ;
        local_48 = local_48 - prVar4->size[uVar6 - 2];
      }
    }
    piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
             operator->(&new_current);
    this = (ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *)
           (piVar3->child + uVar7);
    piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
             operator->(&current);
    if (uVar7 < piVar3->len) {
      piVar3 = ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>
               ::operator->(&current);
      ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::
      operator=(&current,piVar3->child + uVar7);
    }
    uVar5 = uVar5 + 1;
    uVar6 = local_44 - 5;
    ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::~ref
              (&new_current);
  }
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_>::~ref
            (&current);
  return (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *)
         this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* copy_first_k(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const uint32_t k, const uint32_t tail_size)
      {
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
      uint32_t index = in->cnt - 1;
      uint32_t shift = in->shift;

      // Copy all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, copy current node and stick it in.
        ref<internal_node<T, atomic_ref_counting>> new_current;
        if (i != k)
          {
          new_current = internal_node_clone(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table = size_table_clone(new_current->size_table.ptr, new_current->len);
            new_current->size_table->size[new_current->len - 1] += tail_size;
            }
          }
        else
          { // increment size of last element -- will only happen if we append empties
          new_current = internal_node_inc(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table->size[new_current->len - 1] = new_current->size_table->size[new_current->len - 2] + tail_size;
            }
          }
        *to_set = new_current;

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = new_current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &new_current->child[child_index];
        if (child_index < current->len)
          current = current->child[child_index];

        i++;
        shift -= bits<N>::rrb_bits;
        }
      return to_set;
      }